

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O3

void __thiscall MemTable::MemTable(MemTable *this,MemTable *m)

{
  size_t sVar1;
  list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_> *plVar2;
  
  (this->
  super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_Dictionary = (_func_int **)&PTR_size_00110c88;
  plVar2 = &this->qlist;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node._M_size = 0;
  this->_size = 0;
  this->_size_bytes = 0;
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::
  _M_move_assign(plVar2,&m->qlist);
  sVar1 = m->_size_bytes;
  this->_size = m->_size;
  this->_size_bytes = sVar1;
  m->_size = 0;
  m->_size_bytes = 0;
  return;
}

Assistant:

MemTable::MemTable(MemTable &&m) noexcept {
    qlist = std::move(m.qlist);
    _size_bytes = m._size_bytes;
    _size = m._size;
    m._size_bytes = 0;
    m._size = 0;
}